

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<HighsCDouble>::clear(HVectorBase<HighsCDouble> *this)

{
  reference pvVar1;
  reference pvVar2;
  HVectorBase<HighsCDouble> *in_RDI;
  HighsInt i;
  HighsInt dense_clear;
  size_type in_stack_ffffffffffffff98;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffffa0;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_00;
  bool local_39;
  HighsCDouble local_38;
  int local_24;
  HighsCDouble local_20;
  uint local_c;
  
  local_39 = true;
  if (-1 < in_RDI->count) {
    local_39 = (double)in_RDI->size * 0.3 < (double)in_RDI->count;
  }
  local_c = (uint)local_39;
  if (local_c == 0) {
    for (local_24 = 0; local_24 < in_RDI->count; local_24 = local_24 + 1) {
      HighsCDouble::HighsCDouble(&local_38,0.0);
      this_00 = &in_RDI->array;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)local_24);
      pvVar2 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (this_00,(long)*pvVar1);
      pvVar2->hi = local_38.hi;
      pvVar2->lo = local_38.lo;
    }
  }
  else {
    HighsCDouble::HighsCDouble(&local_20,0.0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(value_type *)0x7f79a2);
  }
  clearScalars(in_RDI);
  return;
}

Assistant:

void HVectorBase<Real>::clear() {
  /*
   * Clear an HVector instance
   */
  // Standard HVector to clear
  HighsInt dense_clear = count < 0 || count > size * 0.3;
  if (dense_clear) {
    // Treat the array as full if there are no indices or too many
    // indices
    array.assign(size, Real{0});
  } else {
    // Zero according to the indices of (possible) nonzeros
    for (HighsInt i = 0; i < count; i++) {
      array[index[i]] = 0;
    }
  }
  this->clearScalars();
}